

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O2

void Qentem::Test::TestTrimRight(QTest *test)

{
  uint in_EAX;
  uint local_38;
  SizeT32 end_offset;
  
  _local_38 = (ulong)in_EAX;
  StringUtils::TrimRight<char,unsigned_int>("",0,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0xf4);
  StringUtils::TrimRight<char,unsigned_int>("",1,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0xf7);
  StringUtils::TrimRight<char,unsigned_int>("",10,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0xfa);
  StringUtils::TrimRight<char,unsigned_int>("a",0,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0xfd);
  StringUtils::TrimRight<char,unsigned_int>("abc",0,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x100);
  StringUtils::TrimRight<char,unsigned_int>("a ",1,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x103);
  StringUtils::TrimRight<char,unsigned_int>("abc ",4,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x106);
  StringUtils::TrimRight<char,unsigned_int>("a  ",3,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x109);
  StringUtils::TrimRight<char,unsigned_int>("abc  ",5,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x10c);
  StringUtils::TrimRight<char,unsigned_int>("a   ",4,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x10f);
  StringUtils::TrimRight<char,unsigned_int>("abc   ",6,&end_offset);
  _local_38 = _local_38 & 0xffffffff00000000;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x112);
  end_offset = 2;
  StringUtils::TrimRight<char,unsigned_int>("a ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,1);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x116);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>("abc ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x11a);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("a  ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,1);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x11e);
  end_offset = 5;
  StringUtils::TrimRight<char,unsigned_int>("abc  ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x122);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>("a   ",4,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x126);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>("a   ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,1);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x12a);
  end_offset = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",6,&end_offset);
  _local_38 = CONCAT44(end_offset,6);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x12e);
  end_offset = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",3,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x132);
  end_offset = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",2,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x136);
  end_offset = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x13a);
  end_offset = 2;
  StringUtils::TrimRight<char,unsigned_int>(" a",0,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x13e);
  end_offset = 2;
  StringUtils::TrimRight<char,unsigned_int>(" a",1,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x142);
  end_offset = 2;
  StringUtils::TrimRight<char,unsigned_int>(" a",2,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x146);
  end_offset = 1;
  StringUtils::TrimRight<char,unsigned_int>(" a",0,&end_offset);
  _local_38 = (ulong)end_offset << 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x14a);
  end_offset = 1;
  StringUtils::TrimRight<char,unsigned_int>(" a",1,&end_offset);
  _local_38 = CONCAT44(end_offset,1);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x14e);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>(" abc",0,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x152);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("  a",0,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x156);
  end_offset = 5;
  StringUtils::TrimRight<char,unsigned_int>("  abc",0,&end_offset);
  _local_38 = CONCAT44(end_offset,5);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x15a);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>("   a",0,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x15e);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("   a",0,&end_offset);
  _local_38 = (ulong)end_offset << 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x162);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("   a",2,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x166);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("   a",1,&end_offset);
  _local_38 = CONCAT44(end_offset,1);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x16a);
  end_offset = 6;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,&end_offset);
  _local_38 = CONCAT44(end_offset,6);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x16e);
  end_offset = 5;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,&end_offset);
  _local_38 = CONCAT44(end_offset,5);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x172);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x176);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,&end_offset);
  _local_38 = (ulong)end_offset << 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x17a);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("   abc",1,&end_offset);
  _local_38 = CONCAT44(end_offset,1);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x17e);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("   abc",2,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x182);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>(" a ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x186);
  end_offset = 5;
  StringUtils::TrimRight<char,unsigned_int>(" abc ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x18a);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>(" a  ",4,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x18e);
  end_offset = 5;
  StringUtils::TrimRight<char,unsigned_int>(" a\n\r\t",0,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x192);
  end_offset = 6;
  StringUtils::TrimRight<char,unsigned_int>(" abc  ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x196);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>("  a   ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x19a);
  end_offset = 8;
  StringUtils::TrimRight<char,unsigned_int>("  abc   ",0,&end_offset);
  _local_38 = CONCAT44(end_offset,5);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x19e);
  end_offset = 1;
  StringUtils::TrimRight<char,unsigned_int>(" ",1,&end_offset);
  _local_38 = CONCAT44(end_offset,1);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1a2);
  end_offset = 2;
  StringUtils::TrimRight<char,unsigned_int>("  ",2,&end_offset);
  _local_38 = CONCAT44(end_offset,2);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1a6);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>("   ",3,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1aa);
  end_offset = 3;
  StringUtils::TrimRight<char,unsigned_int>(" a ",3,&end_offset);
  _local_38 = CONCAT44(end_offset,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1ae);
  end_offset = 5;
  StringUtils::TrimRight<char,unsigned_int>(" abc ",5,&end_offset);
  _local_38 = CONCAT44(end_offset,5);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1b2);
  end_offset = 4;
  StringUtils::TrimRight<char,unsigned_int>(" a  ",4,&end_offset);
  _local_38 = CONCAT44(end_offset,4);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1b6);
  end_offset = 6;
  StringUtils::TrimRight<char,unsigned_int>(" abc  ",6,&end_offset);
  _local_38 = CONCAT44(end_offset,6);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1ba);
  end_offset = 7;
  StringUtils::TrimRight<char,unsigned_int>("  a    ",6,&end_offset);
  _local_38 = CONCAT44(end_offset,6);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1be);
  end_offset = 8;
  StringUtils::TrimRight<char,unsigned_int>("  abc   ",4,&end_offset);
  _local_38 = CONCAT44(end_offset,5);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&end_offset,&stack0xffffffffffffffc8,0x1c2);
  return;
}

Assistant:

static void TestTrimRight(QTest &test) {
    SizeT32 end_offset = 0;

    StringUtils::TrimRight("", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 10U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a ", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a  ", 3U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc  ", 5U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("a ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("abc ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("a  ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 2U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("  a", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("  abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" a\n\r\t", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("  a   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" ", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("  ", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 5U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 7;
    StringUtils::TrimRight("  a    ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 4U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);
}